

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_barriers.cpp
# Opt level: O2

spv_result_t spvtools::val::BarriersPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer puVar2;
  bool bVar3;
  spv_result_t sVar4;
  Op OVar5;
  uint32_t uVar6;
  Function *pFVar7;
  char *pcVar8;
  uint scope;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  DiagnosticStream local_1f8;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x149) {
    uVar6 = ValidationState_t::GetOperandTypeId(_,inst,0);
    OVar5 = ValidationState_t::GetIdOpcode(_,uVar6);
    if (OVar5 != OpTypeNamedBarrier) {
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = spvOpcodeString(OpMemoryNamedBarrier);
      std::operator<<((ostream *)&local_1f8,pcVar8);
      pcVar8 = ": expected Named Barrier to be of type OpTypeNamedBarrier";
LAB_0052145b:
      std::operator<<((ostream *)&local_1f8,pcVar8);
      DiagnosticStream::~DiagnosticStream(&local_1f8);
      return local_1f8.error_;
    }
    scope = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[2];
  }
  else {
    if (uVar1 == 0xe1) {
      scope = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[1];
      sVar4 = ValidateMemoryScope(_,inst,scope);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      uVar6 = 1;
      goto LAB_005213d7;
    }
    if (uVar1 == 0x148) {
      OVar5 = ValidationState_t::GetIdOpcode(_,(inst->inst_).type_id);
      if (OVar5 == OpTypeNamedBarrier) {
        uVar6 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar3 = ValidationState_t::IsIntScalarType(_,uVar6);
        if ((bVar3) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20)) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar8 = spvOpcodeString(OpNamedBarrierInitialize);
        std::operator<<((ostream *)&local_1f8,pcVar8);
        pcVar8 = ": expected Subgroup Count to be a 32-bit int";
      }
      else {
        ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar8 = spvOpcodeString(OpNamedBarrierInitialize);
        std::operator<<((ostream *)&local_1f8,pcVar8);
        pcVar8 = ": expected Result Type to be OpTypeNamedBarrier";
      }
      goto LAB_0052145b;
    }
    if (uVar1 != 0xe0) {
      return SPV_SUCCESS;
    }
    if (_->version_ < 0x10300) {
      pFVar7 = ValidationState_t::function(_,inst->function_->id_);
      local_218._M_unused._M_object = (void *)0x0;
      local_218._8_8_ = 0;
      local_200 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                  ::_M_invoke;
      local_208 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                  ::_M_manager;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&pFVar7->execution_model_limitations_,(value_type *)&local_218);
      if (local_208 != (code *)0x0) {
        (*local_208)(&local_218,&local_218,__destroy_functor);
      }
    }
    puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    scope = puVar2[2];
    sVar4 = ValidateExecutionScope(_,inst,puVar2[1]);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
  }
  sVar4 = ValidateMemoryScope(_,inst,scope);
  if (sVar4 != SPV_SUCCESS) {
    return sVar4;
  }
  uVar6 = 2;
LAB_005213d7:
  sVar4 = ValidateMemorySemantics(_,inst,uVar6,scope);
  if (sVar4 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar4;
}

Assistant:

spv_result_t BarriersPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpControlBarrier: {
      if (_.version() < SPV_SPIRV_VERSION_WORD(1, 3)) {
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [](spv::ExecutionModel model, std::string* message) {
                  if (model != spv::ExecutionModel::TessellationControl &&
                      model != spv::ExecutionModel::GLCompute &&
                      model != spv::ExecutionModel::Kernel &&
                      model != spv::ExecutionModel::TaskNV &&
                      model != spv::ExecutionModel::MeshNV) {
                    if (message) {
                      *message =
                          "OpControlBarrier requires one of the following "
                          "Execution "
                          "Models: TessellationControl, GLCompute, Kernel, "
                          "MeshNV or TaskNV";
                    }
                    return false;
                  }
                  return true;
                });
      }

      const uint32_t execution_scope = inst->word(1);
      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpMemoryBarrier: {
      const uint32_t memory_scope = inst->word(1);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 1, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpNamedBarrierInitialize: {
      if (_.GetIdOpcode(result_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Result Type to be OpTypeNamedBarrier";
      }

      const uint32_t subgroup_count_type = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(subgroup_count_type) ||
          _.GetBitWidth(subgroup_count_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Subgroup Count to be a 32-bit int";
      }
      break;
    }

    case spv::Op::OpMemoryNamedBarrier: {
      const uint32_t named_barrier_type = _.GetOperandTypeId(inst, 0);
      if (_.GetIdOpcode(named_barrier_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Named Barrier to be of type OpTypeNamedBarrier";
      }

      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}